

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textlabel.cpp
# Opt level: O2

void __thiscall QtMWidgets::TextLabel::resizeEvent(TextLabel *this,QResizeEvent *e)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int extraout_EDX;
  
  iVar2 = QWidget::contentsMargins();
  iVar1 = *(int *)(e + 0x10);
  iVar3 = QFrame::frameWidth();
  QStaticText::setTextWidth
            ((double)(iVar1 - (extraout_EDX + iVar2 + (iVar3 + ((this->d).d)->margin) * 2)));
  e[0xc] = (QResizeEvent)0x1;
  return;
}

Assistant:

void
TextLabel::resizeEvent( QResizeEvent * e )
{
	const QMargins margins = contentsMargins();

	d->staticText.setTextWidth( e->size().width() - 2 * frameWidth() -
		margins.left() - margins.right() - 2 * d->margin );

	e->accept();
}